

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# were.c
# Opt level: O0

void you_unwere(boolean purify)

{
  char cVar1;
  boolean purify_local;
  
  if (purify != '\0') {
    pline("You feel purified.");
    u.ulycn = -1;
  }
  if (((u.uprops[0x3d].intrinsic == 0) && (u.uprops[0x3d].extrinsic == 0)) &&
     (((youmonst.data)->mflags2 & 4) != 0)) {
    if (((u.uprops[0x11].intrinsic != 0) || (u.uprops[0x11].extrinsic != 0)) &&
       (cVar1 = yn_function("Remain in beast form?","yn",'n'), cVar1 != 'n')) {
      return;
    }
    rehumanize();
  }
  return;
}

Assistant:

void you_unwere(boolean purify)
{
	if (purify) {
	    pline("You feel purified.");
	    u.ulycn = NON_PM;	/* cure lycanthropy */
	}
	if (!Unchanging && is_were(youmonst.data) &&
		(!Polymorph_control || yn("Remain in beast form?") == 'n'))
	    rehumanize();
}